

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

bool __thiscall wasm::Analyzer::processExpressions(Analyzer *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  ModuleElement element_00;
  bool bVar3;
  size_type sVar4;
  reference ppEVar5;
  Module **this_00;
  reference ppVar6;
  pointer *this_01;
  reference pHVar7;
  pointer *this_02;
  reference pNVar8;
  pointer *this_03;
  reference ppVar9;
  StructField structField_00;
  pair<wasm::HeapType,_unsigned_int> structField;
  __normal_iterator<std::pair<wasm::HeapType,_unsigned_int>_*,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>
  local_230;
  iterator __end3_3;
  iterator __begin3_3;
  vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  *__range3_3;
  Name func;
  iterator __end3_2;
  iterator __begin3_2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range3_2;
  HeapType type;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range3_1;
  pair<wasm::ModuleElementKind,_wasm::Name> element;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
  *__range3;
  undefined1 local_158 [8];
  ReferenceFinder finder;
  Expression *curr;
  bool worked;
  Analyzer *this_local;
  
  curr._7_1_ = false;
  while( true ) {
    sVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      (&this->expressionQueue);
    if (sVar4 == 0) break;
    curr._7_1_ = true;
    ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::back
                        (&this->expressionQueue);
    finder.structFields.
    super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppEVar5;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
              (&this->expressionQueue);
    ReferenceFinder::ReferenceFinder((ReferenceFinder *)local_158);
    Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::setModule
              ((Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_> *)
               local_158,this->module);
    Visitor<wasm::ReferenceFinder,_void>::visit
              ((Visitor<wasm::ReferenceFinder,_void> *)local_158,
               (Expression *)
               finder.structFields.
               super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = &finder.
               super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
               super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
               currModule;
    __end3 = std::
             vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
             ::begin((vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                      *)this_00);
    element.second.super_IString.str._M_str =
         (char *)std::
                 vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                 ::end((vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                        *)this_00);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
                                  *)&element.second.super_IString.str._M_str);
      if (!bVar3) break;
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
               ::operator*(&__end3);
      element.second.super_IString.str._M_len = (size_t)(ppVar6->second).super_IString.str._M_str;
      element._0_8_ = (ppVar6->second).super_IString.str._M_len;
      element_00.first = ppVar6->first;
      element_00._4_4_ = *(undefined4 *)&ppVar6->field_0x4;
      element_00.second.super_IString.str = (ppVar6->second).super_IString;
      use(this,element_00);
      __gnu_cxx::
      __normal_iterator<std::pair<wasm::ModuleElementKind,_wasm::Name>_*,_std::vector<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>_>
      ::operator++(&__end3);
    }
    this_01 = &finder.elements.
               super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3_1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
    type.id = (uintptr_t)
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_01);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                          *)&type);
      if (!bVar3) break;
      pHVar7 = __gnu_cxx::
               __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
               ::operator*(&__end3_1);
      useCallRefType(this,(HeapType)pHVar7->id);
      __gnu_cxx::
      __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
      ::operator++(&__end3_1);
    }
    this_02 = &finder.callRefTypes.
               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end3_2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_02);
    func.super_IString.str._M_str =
         (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)this_02);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3_2,
                         (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                          *)&func.super_IString.str._M_str);
      if (!bVar3) break;
      pNVar8 = __gnu_cxx::
               __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
               ::operator*(&__end3_2);
      func.super_IString.str._M_len = (size_t)(pNVar8->super_IString).str._M_str;
      useRefFunc(this,(Name)(pNVar8->super_IString).str);
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end3_2);
    }
    this_03 = &finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end3_3 = std::
               vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
               ::begin((vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                        *)this_03);
    local_230._M_current =
         (pair<wasm::HeapType,_unsigned_int> *)
         std::
         vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
         ::end((vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                *)this_03);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=(&__end3_3,&local_230);
      if (!bVar3) break;
      ppVar9 = __gnu_cxx::
               __normal_iterator<std::pair<wasm::HeapType,_unsigned_int>_*,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>
               ::operator*(&__end3_3);
      uVar1 = ppVar9->first;
      uVar2 = ppVar9->second;
      structField_00.second = uVar2;
      structField_00.first.id = uVar1;
      structField_00._12_4_ = 0;
      useStructField(this,structField_00);
      __gnu_cxx::
      __normal_iterator<std::pair<wasm::HeapType,_unsigned_int>_*,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>
      ::operator++(&__end3_3);
    }
    scanChildren(this,(Expression *)
                      finder.structFields.
                      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ReferenceFinder::~ReferenceFinder((ReferenceFinder *)local_158);
  }
  return curr._7_1_;
}

Assistant:

bool processExpressions() {
    bool worked = false;
    while (expressionQueue.size()) {
      worked = true;

      auto* curr = expressionQueue.back();
      expressionQueue.pop_back();

      // Find references in this expression, and apply them. Anything found here
      // is used.
      ReferenceFinder finder;
      finder.setModule(module);
      finder.visit(curr);
      for (auto element : finder.elements) {
        use(element);
      }
      for (auto type : finder.callRefTypes) {
        useCallRefType(type);
      }
      for (auto func : finder.refFuncs) {
        useRefFunc(func);
      }
      for (auto structField : finder.structFields) {
        useStructField(structField);
      }

      // Scan the children to continue our work.
      scanChildren(curr);
    }
    return worked;
  }